

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall chrono::utils::Generator::writeObjectInfo(Generator *this,string *filename)

{
  long lVar1;
  char cVar2;
  pointer pBVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  CSV_writer csv;
  string local_1f0;
  string *local_1d0;
  CSV_writer local_1c8;
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,",","");
  CSV_writer::CSV_writer(&local_1c8,&local_1f0);
  local_1d0 = filename;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  pBVar3 = (this->m_bodies).
           super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_bodies).
      super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar3) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (&local_1c8.m_ss,*(int *)((long)(pBVar3->m_size).m_data + lVar7 + -0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      lVar1 = *(long *)((long)&(((shared_ptr<chrono::ChBody> *)
                                (&((this->m_bodies).
                                   super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_size + 1))->
                               super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar7);
      poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x80));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x88));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar1 + 0x90));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      pBVar3 = (this->m_bodies).
               super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar4 = std::ostream::_M_insert<double>(*(double *)((long)(pBVar3->m_size).m_data + lVar7));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)((long)(pBVar3->m_size).m_data + lVar7 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)((long)(pBVar3->m_size).m_data + lVar7 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)(((this->m_bodies).
                                    super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_size).m_data +
                           lVar7 + -8));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      poVar4 = std::ostream::_M_insert<double>
                         (*(double *)
                           (*(long *)((long)&(((shared_ptr<chrono::ChBody> *)
                                              (&((this->m_bodies).
                                                 super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->m_size
                                              + 1))->
                                             super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_ptr + lVar7) + 0x2e8));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,local_1c8.m_delim._M_dataplus._M_p,local_1c8.m_delim._M_string_length);
      cVar2 = (char)&local_1c8.m_ss;
      std::ios::widen((char)*(undefined8 *)(local_1c8._32_8_ + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      pBVar3 = (this->m_bodies).
               super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x38;
      uVar5 = ((long)(this->m_bodies).
                     super__Vector_base<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 3) *
              0x6db6db6db6db6db7;
    } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
  CSV_writer::write_to_file(&local_1c8,local_1d0,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  CSV_writer::~CSV_writer(&local_1c8);
  return;
}

Assistant:

void Generator::writeObjectInfo(const std::string& filename) {
    CSV_writer csv;

    for (int i = 0; i < m_bodies.size(); i++) {
        csv << static_cast<int>(m_bodies[i].m_type);
        csv << m_bodies[i].m_body->GetPos() << m_bodies[i].m_size;
        csv << m_bodies[i].m_density << m_bodies[i].m_body->GetMass();

        //// RADU: write collision shape information, including contact material properties?

        csv << std::endl;
    }

    csv.write_to_file(filename);
}